

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UCharsTrieBuilder::buildUnicodeString
          (UCharsTrieBuilder *this,UStringTrieBuildOption buildOption,UnicodeString *result,
          UErrorCode *errorCode)

{
  UErrorCode *this_00;
  UBool UVar1;
  ConstChar16Ptr local_30;
  UErrorCode *local_28;
  UErrorCode *errorCode_local;
  UnicodeString *result_local;
  UCharsTrieBuilder *pUStack_10;
  UStringTrieBuildOption buildOption_local;
  UCharsTrieBuilder *this_local;
  
  local_28 = errorCode;
  errorCode_local = (UErrorCode *)result;
  result_local._4_4_ = buildOption;
  pUStack_10 = this;
  buildUChars(this,buildOption,errorCode);
  UVar1 = ::U_SUCCESS(*local_28);
  this_00 = errorCode_local;
  if (UVar1 != '\0') {
    ConstChar16Ptr::ConstChar16Ptr
              (&local_30,this->uchars + (this->ucharsCapacity - this->ucharsLength));
    UnicodeString::setTo((UnicodeString *)this_00,'\0',&local_30,this->ucharsLength);
    ConstChar16Ptr::~ConstChar16Ptr(&local_30);
  }
  return (UnicodeString *)errorCode_local;
}

Assistant:

UnicodeString &
UCharsTrieBuilder::buildUnicodeString(UStringTrieBuildOption buildOption, UnicodeString &result,
                                      UErrorCode &errorCode) {
    buildUChars(buildOption, errorCode);
    if(U_SUCCESS(errorCode)) {
        result.setTo(FALSE, uchars+(ucharsCapacity-ucharsLength), ucharsLength);
    }
    return result;
}